

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O3

void UnitTest::_UnitTest_Compare::print(char *str)

{
  bool bVar1;
  undefined8 in_RAX;
  char *pcVar2;
  char *__s;
  size_t sVar3;
  ostream *poVar4;
  char *__s_00;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  pcVar2 = strchr(str,10);
  if (pcVar2 != (char *)0x0) {
    if ((long)pcVar2 - (long)str == 0) {
      uStack_28._0_7_ = CONCAT16(10,(undefined6)uStack_28);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)((long)&uStack_28 + 6),1);
      if (DAT_00106179 == '\0') {
        pcVar2 = _unittest_fail()::str;
        if (_unittest_fail()::str == (char *)0x0) {
          bVar1 = mayUseColor((ostream *)&std::cout);
          pcVar2 = " FAIL: ";
          _unittest_fail()::str = pcVar2;
          if (bVar1) {
            pcVar2 = " \x1b[1;40;31mFAIL:\x1b[0m ";
            _unittest_fail()::str = pcVar2;
          }
        }
      }
      else {
        pcVar2 = "XFAIL: ";
      }
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar2,sVar3);
      if (DAT_00106198 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,anon_var_dwarf_3c79,4);
      }
      pcVar2 = str + 1;
    }
    else {
      __s = strdup(str);
      __s[(long)pcVar2 - (long)str] = '\0';
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar3);
      uStack_28 = CONCAT17(10,(undefined7)uStack_28);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)((long)&uStack_28 + 7),1);
      if (DAT_00106179 == '\0') {
        __s_00 = _unittest_fail()::str;
        if (_unittest_fail()::str == (char *)0x0) {
          bVar1 = mayUseColor((ostream *)&std::cout);
          __s_00 = " FAIL: ";
          _unittest_fail()::str = __s_00;
          if (bVar1) {
            __s_00 = " \x1b[1;40;31mFAIL:\x1b[0m ";
            _unittest_fail()::str = __s_00;
          }
        }
      }
      else {
        __s_00 = "XFAIL: ";
      }
      sVar3 = strlen(__s_00);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s_00,sVar3);
      if (DAT_00106198 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,anon_var_dwarf_3c79,4);
      }
      free(__s);
      pcVar2 = pcVar2 + 1;
    }
    print(pcVar2);
    return;
  }
  if (str == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070e0);
    return;
  }
  sVar3 = strlen(str);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,str,sVar3);
  return;
}

Assistant:

static void print(const char *str) {
    const char *pos = 0;
    if (0 != (pos = std::strchr(str, '\n'))) {
      if (pos == str) {
        std::cout << '\n' << _unittest_fail();
        if (!global_unit_test_object_.vim_lines) {
          std::cout << "│ ";
        }
        print(&str[1]);
      } else {
        char *left = strdup(str);
        left[pos - str] = '\0';
        std::cout << left << '\n' << _unittest_fail();
        if (!global_unit_test_object_.vim_lines) {
          std::cout << "│ ";
        }
        free(left);
        print(&pos[1]);
      }
    } else {
      std::cout << str;
    }
  }